

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::decode_full_code
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *full_code)

{
  ulong uVar1;
  ulong uVar2;
  _Bit_iterator local_38;
  
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_38.super__Bit_iterator_base._M_p =
       (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  local_38.super__Bit_iterator_base._M_offset = 0;
  uVar2 = 0;
  while (uVar1 = *local_38.super__Bit_iterator_base._M_p,
        std::_Bit_iterator::operator++(&local_38,0), (uVar1 >> (uVar2 & 0x3f) & 1) != 0) {
    uVar2 = (ulong)local_38.super__Bit_iterator_base._M_offset;
  }
  while ((local_38.super__Bit_iterator_base._M_p !=
          (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p ||
         (local_38.super__Bit_iterator_base._M_offset !=
          (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset))) {
    std::vector<bool,_std::allocator<bool>_>::push_back
              (__return_storage_ptr__,
               (*local_38.super__Bit_iterator_base._M_p >>
                ((ulong)local_38.super__Bit_iterator_base._M_offset & 0x3f) & 1) != 0);
    std::_Bit_iterator::operator++(&local_38,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> HuffmanArchiver::decode_full_code(std::vector<bool> full_code) {
    std::vector<bool> code;
    auto it = full_code.begin();
    while (*it == 1) {
        it++;
    }
    it++;
    for (; it != full_code.end(); it++) {
        code.push_back(*it);
    }
    return code;
}